

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_2,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int col;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float v;
  float fVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  float fVar12;
  Vector<float,_3> res;
  Type in1;
  int aiStack_18 [6];
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar6 = (evalCtx->coords).m_data[0];
    fVar7 = (evalCtx->coords).m_data[1];
  }
  else {
    fVar6 = 1.2;
    fVar7 = 0.5;
  }
  pfVar1 = in1.m_data.m_data[0].m_data + 1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pfVar4 = (float *)&in1;
    bVar11 = true;
    do {
      bVar2 = bVar11;
      lVar5 = 0;
      auVar9 = _DAT_00a99400;
      do {
        bVar11 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar11) {
          fVar12 = 1.0;
          if (lVar3 != lVar5) {
            fVar12 = 0.0;
          }
          pfVar4[lVar5 * 2] = fVar12;
        }
        if (bVar11) {
          fVar12 = 1.0;
          if (lVar3 + -1 != lVar5) {
            fVar12 = 0.0;
          }
          pfVar4[lVar5 * 2 + 2] = fVar12;
        }
        lVar5 = lVar5 + 2;
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
      } while (lVar5 != 4);
      lVar3 = 1;
      pfVar4 = pfVar1;
      bVar11 = false;
    } while (bVar2);
    in1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in1.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[2].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[1] = 0.0;
    lVar3 = 0;
    pfVar4 = (float *)&in1;
    bVar11 = true;
    do {
      bVar2 = bVar11;
      lVar5 = 0;
      do {
        pfVar4[lVar5 * 2] = *(float *)((long)&DAT_00af0a58 + lVar5 * 4 + lVar3);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar3 = 0xc;
      pfVar4 = pfVar1;
      bVar11 = false;
    } while (bVar2);
  }
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar5 = 0;
    bVar11 = true;
    fVar12 = fVar6;
    do {
      bVar2 = bVar11;
      fVar8 = fVar8 + fVar12 * in1.m_data.m_data[lVar3].m_data[lVar5];
      lVar5 = 1;
      bVar11 = false;
      fVar12 = fVar7;
    } while (bVar2);
    res.m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}